

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolPartialJPolValPair.cpp
# Opt level: O2

void __thiscall
PolicyPoolPartialJPolValPair::~PolicyPoolPartialJPolValPair(PolicyPoolPartialJPolValPair *this)

{
  priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
  *this_00;
  
  (this->super_PartialPolicyPoolInterface)._vptr_PartialPolicyPoolInterface =
       (_func_int **)&PTR__PolicyPoolPartialJPolValPair_005e5120;
  while (this_00 = this->_m_jpvpQueue_p,
        (this_00->c).
        super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this_00->c).
        super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
    std::
    priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::pop(this_00);
  }
  std::
  vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ::~vector(&this_00->c);
  operator_delete(this_00,0x20);
  return;
}

Assistant:

PolicyPoolPartialJPolValPair::~PolicyPoolPartialJPolValPair()
{
    while(_m_jpvpQueue_p->size() > 0)
    {
//        delete _m_jpvpQueue_p->top();
        _m_jpvpQueue_p->pop();
    }
    delete _m_jpvpQueue_p;
}